

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O0

Simple * dto::unmarshall<dto::Simple>(Simple *__return_storage_ptr__,string *packet)

{
  ulong uVar1;
  Error *this;
  void *pvVar2;
  long lVar3;
  void *__src;
  long lVar4;
  allocator<char> local_51;
  string local_50 [48];
  int local_20;
  undefined1 local_19;
  int hdr_size;
  string *packet_local;
  Simple *dto;
  
  local_19 = 0;
  _hdr_size = packet;
  packet_local = (string *)__return_storage_ptr__;
  Simple::Simple(__return_storage_ptr__);
  local_20 = 0x12;
  uVar1 = std::__cxx11::string::size();
  if ((ulong)(long)local_20 <= uVar1) {
    pvVar2 = (void *)std::__cxx11::string::operator[]((ulong)_hdr_size);
    memcpy(__return_storage_ptr__,pvVar2,(long)local_20);
    lVar3 = std::__cxx11::string::size();
    lVar4 = (long)local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,lVar3 - lVar4,'\0',&local_51);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->payload,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    pvVar2 = (void *)std::__cxx11::string::operator[]((ulong)&__return_storage_ptr__->payload);
    __src = (void *)std::__cxx11::string::operator[]((ulong)_hdr_size);
    lVar3 = std::__cxx11::string::size();
    memcpy(pvVar2,__src,lVar3 - local_20);
    do_ntoh(&__return_storage_ptr__->header);
    return __return_storage_ptr__;
  }
  this = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this,"Too small packet");
  __cxa_throw(this,&Error::typeinfo,Error::~Error);
}

Assistant:

inline T unmarshall(std::string &packet) {
  T dto;
  int hdr_size = sizeof(decltype(dto.header));
  if (packet.size() < hdr_size) {
    throw Error("Too small packet");
  }
  memcpy(&dto.header, &packet[0], hdr_size);
  dto.payload = std::string(packet.size() - hdr_size, '\0');
  memcpy(&dto.payload[0], &packet[hdr_size], packet.size() - hdr_size);
  do_ntoh(&dto.header);
  return dto;
}